

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::AddWriteChain(Buffer *this,BufferChain *bc)

{
  if (this->m_writeHead == (BufferChain *)0x0) {
    this->m_writeHead = bc;
  }
  else {
    this->m_writeTail->nextpkt = bc;
  }
  this->m_writeTail = bc;
  return;
}

Assistant:

void Buffer::AddWriteChain(BufferChain *bc)
{
    if(this->m_writeHead == nullptr)
    {
        this->m_writeHead = bc;
        this->m_writeTail = bc;
    }
    else
    {
        this->m_writeTail->nextpkt = bc;
        this->m_writeTail = bc;
    }
}